

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

RTPRawPacket * __thiscall jrtplib::RTPTCPTransmitter::GetNextPacket(RTPTCPTransmitter *this)

{
  bool bVar1;
  reference ppRVar2;
  _List_iterator<jrtplib::RTPRawPacket_*> local_28;
  RTPTCPTransmitter *local_20;
  RTPRawPacket *p;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local = (RTPTCPTransmitter *)0x0;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local = (RTPTCPTransmitter *)0x0;
  }
  else {
    p = (RTPRawPacket *)this;
    bVar1 = std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
            empty(&this->m_rawpacketlist);
    if (bVar1) {
      this_local = (RTPTCPTransmitter *)0x0;
    }
    else {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
           begin(&this->m_rawpacketlist);
      ppRVar2 = std::_List_iterator<jrtplib::RTPRawPacket_*>::operator*(&local_28);
      local_20 = (RTPTCPTransmitter *)*ppRVar2;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      pop_front(&this->m_rawpacketlist);
      this_local = local_20;
    }
  }
  return (RTPRawPacket *)this_local;
}

Assistant:

RTPRawPacket *RTPTCPTransmitter::GetNextPacket()
{
	if (!m_init)
		return 0;
	
	MAINMUTEX_LOCK
	
	RTPRawPacket *p;
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return 0;
	}
	if (m_rawpacketlist.empty())
	{
		MAINMUTEX_UNLOCK
		return 0;
	}

	p = *(m_rawpacketlist.begin());
	m_rawpacketlist.pop_front();

	MAINMUTEX_UNLOCK
	return p;
}